

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int inputSize)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  long *pInLimit;
  long *plVar9;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  long *plVar13;
  char *pcVar14;
  ulong uVar15;
  long *plVar16;
  BYTE *src;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  char *__s;
  char *pcVar20;
  BYTE *s;
  long *pIn;
  long lVar21;
  U32 *hashTable;
  char *local_a0;
  
  src = (BYTE *)((ulong)(uint)LZ4_dict->table[0x803] + LZ4_dict->table[0x801]);
  if (source < src) {
    src = (BYTE *)source;
  }
  LZ4_renormDictT((LZ4_stream_t_internal *)LZ4_dict,src);
  iVar7 = 0;
  if ((uint)inputSize < 0x7e000001) {
    __s = dest;
    pIn = (long *)source;
    if (0xc < (uint)inputSize) {
      uVar2 = (uint)LZ4_dict->table[0x803];
      pcVar14 = (char *)LZ4_dict->table[0x801];
      uVar5 = (uint)LZ4_dict->table[0x800];
      uVar15 = (ulong)uVar5;
      *(uint *)((long)LZ4_dict->table +
               (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) = uVar5
      ;
      if (inputSize != 0xd) {
        plVar10 = (long *)(source + (long)inputSize + -0xc);
        pInLimit = (long *)(source + (long)inputSize + -5);
        lVar21 = (long)source - uVar15;
        plVar9 = (long *)(source + 2);
LAB_001551aa:
        lVar11 = *(long *)((long)pIn + 1);
        uVar17 = 1;
        plVar16 = (long *)((long)pIn + 1);
        uVar5 = 0x41;
        do {
          plVar13 = plVar9;
          uVar19 = (ulong)((uint)((ulong)(lVar11 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
          uVar12 = (ulong)*(uint *)((long)LZ4_dict->table + uVar19 * 4);
          lVar11 = *plVar13;
          iVar7 = (int)lVar21;
          *(int *)((long)LZ4_dict->table + uVar19 * 4) = (int)plVar16 - iVar7;
          if (plVar16 <= (long *)(lVar21 + uVar12 + 0xffff)) {
            pcVar8 = (char *)(lVar21 + uVar12);
            pcVar18 = (char *)0x0;
            if (pcVar8 < source) {
              pcVar18 = pcVar14 + ((ulong)uVar2 - (long)source);
            }
            if (*(int *)(pcVar8 + (long)pcVar18) == (int)*plVar16) goto LAB_0015523e;
          }
          plVar9 = (long *)(uVar17 + (long)plVar13);
          uVar17 = (ulong)(uVar5 >> 6);
          plVar16 = plVar13;
          uVar5 = uVar5 + 1;
          if (plVar10 < plVar9) break;
        } while( true );
      }
    }
LAB_0015507f:
    pcVar14 = source + ((long)inputSize - (long)pIn);
    if (pcVar14 < (char *)0xf) {
      *__s = (char)pcVar14 << 4;
    }
    else {
      pcVar8 = pcVar14 + -0xf;
      *__s = -0x10;
      pcVar18 = __s + 1;
      if ((char *)0xfe < pcVar8) {
        uVar15 = (ulong)(pcVar14 + -0x10e) / 0xff;
        memset(pcVar18,0xff,uVar15 + 1);
        pcVar18 = __s + uVar15 + 2;
        pcVar8 = pcVar14 + uVar15 * -0xff + -0x10e;
      }
      *pcVar18 = (char)pcVar8;
      __s = pcVar18;
    }
    memcpy(__s + 1,pIn,(size_t)pcVar14);
    iVar7 = ((int)(__s + 1) + (int)pcVar14) - (int)dest;
  }
  LZ4_dict->table[0x801] = (longlong)source;
  *(int *)(LZ4_dict->table + 0x803) = inputSize;
  *(int *)(LZ4_dict->table + 0x800) = (int)LZ4_dict->table[0x800] + inputSize;
  return iVar7;
LAB_0015523e:
  pcVar20 = source;
  if (pcVar8 < source) {
    pcVar20 = pcVar14;
  }
  if ((pIn < plVar16) && (pcVar20 < pcVar8 + (long)pcVar18)) {
    lVar11 = 0;
    do {
      if (*(char *)((long)plVar16 + lVar11 + -1) !=
          source[(long)(pcVar18 + lVar11 + ~uVar15 + uVar12)]) {
        lVar4 = lVar11 + (uVar12 - uVar15);
        goto LAB_001552a7;
      }
      lVar1 = lVar11 + -1;
    } while ((pIn < (long *)((long)plVar16 + lVar11 + -1)) &&
            (lVar4 = lVar11 + ~uVar15 + uVar12, lVar11 = lVar1,
            pcVar20 < source + (long)(pcVar18 + lVar4)));
    lVar4 = lVar1 + (uVar12 - uVar15);
    lVar11 = lVar1;
LAB_001552a7:
    pcVar8 = source + lVar4;
    plVar16 = (long *)((long)plVar16 + lVar11);
  }
  uVar17 = (long)plVar16 - (long)pIn;
  plVar9 = (long *)(__s + 1);
  if ((uint)uVar17 < 0xf) {
    *__s = (char)uVar17 << 4;
  }
  else {
    uVar5 = (uint)uVar17 - 0xf;
    *__s = -0x10;
    if (0xfe < (int)uVar5) {
      if (0x1fc < uVar5) {
        uVar5 = 0x1fd;
      }
      uVar12 = (ulong)(((int)plVar16 - (uVar5 + (int)pIn)) + 0xef) / 0xff;
      memset(plVar9,0xff,uVar12 + 1);
      plVar9 = (long *)(__s + uVar12 + 2);
      uVar5 = (((int)plVar16 - (int)pIn) + (int)uVar12 * -0xff) - 0x10e;
    }
    *(char *)plVar9 = (char)uVar5;
    plVar9 = (long *)((long)plVar9 + 1);
  }
  plVar13 = (long *)((uVar17 & 0xffffffff) + (long)plVar9);
  do {
    *plVar9 = *pIn;
    plVar9 = plVar9 + 1;
    pIn = pIn + 1;
    local_a0 = __s;
  } while (plVar9 < plVar13);
  while( true ) {
    *(short *)plVar13 = (short)plVar16 - (short)pcVar8;
    if (pcVar20 == pcVar14) {
      plVar9 = (long *)(pcVar14 + ((ulong)uVar2 - (long)(pcVar8 + (long)pcVar18)) + (long)plVar16);
      if (pInLimit < pcVar14 + ((ulong)uVar2 - (long)(pcVar8 + (long)pcVar18)) + (long)plVar16) {
        plVar9 = pInLimit;
      }
      uVar5 = LZ4_count((BYTE *)((long)plVar16 + 4),(BYTE *)(pcVar8 + (long)(pcVar18 + 4)),
                        (BYTE *)plVar9);
      pIn = (long *)((long)plVar16 + (ulong)(uVar5 + 4));
      if (pIn == plVar9) {
        uVar6 = LZ4_count((BYTE *)pIn,(BYTE *)source,(BYTE *)pInLimit);
        uVar5 = uVar5 + uVar6;
        pIn = (long *)((long)pIn + (ulong)uVar6);
      }
    }
    else {
      uVar5 = LZ4_count((BYTE *)((long)plVar16 + 4),(BYTE *)(pcVar8 + 4),(BYTE *)pInLimit);
      pIn = (long *)((long)plVar16 + (ulong)(uVar5 + 4));
    }
    __s = (char *)((long)plVar13 + 2);
    if (uVar5 < 0xf) {
      *local_a0 = *local_a0 + (char)uVar5;
    }
    else {
      *local_a0 = *local_a0 + '\x0f';
      uVar6 = uVar5 - 0xf;
      if (0x1fd < uVar6) {
        uVar3 = ((uVar5 - 0x20d) / 0x1fe) * 2;
        memset(__s,0xff,(ulong)uVar3 + 2);
        uVar6 = (uVar3 + ((uVar5 - 0x20d) / 0x1fe) * -0x200 + uVar5) - 0x20d;
        __s = (char *)((ulong)uVar3 + 4 + (long)plVar13);
      }
      if (0xfe < uVar6) {
        uVar6 = uVar6 - 0xff;
        *__s = -1;
        __s = __s + 1;
      }
      *__s = (char)uVar6;
      __s = __s + 1;
    }
    if (plVar10 < pIn) goto LAB_0015507f;
    *(int *)((long)LZ4_dict->table +
            (ulong)((uint)((ulong)(*(long *)((long)pIn + -2) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4)
         = ((int)pIn + -2) - iVar7;
    uVar17 = (ulong)((uint)((ulong)(*pIn * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
    uVar12 = (ulong)*(uint *)((long)LZ4_dict->table + uVar17 * 4);
    pcVar8 = (char *)(lVar21 + uVar12);
    pcVar20 = source;
    pcVar18 = (char *)0x0;
    if (pcVar8 < source) {
      pcVar20 = pcVar14;
      pcVar18 = pcVar14 + ((ulong)uVar2 - (long)source);
    }
    *(int *)((long)LZ4_dict->table + uVar17 * 4) = (int)pIn - iVar7;
    if (((long *)(lVar21 + uVar12 + 0xffff) < pIn) ||
       (*(int *)(pcVar8 + (long)pcVar18) != (int)*pIn)) break;
    plVar13 = (long *)(__s + 1);
    *__s = '\0';
    plVar16 = pIn;
    local_a0 = __s;
  }
  plVar9 = (long *)((long)pIn + 2);
  if (plVar10 < plVar9) goto LAB_0015507f;
  goto LAB_001551aa;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int inputSize)
{
    LZ4_stream_t_internal* streamPtr = (LZ4_stream_t_internal*)LZ4_dict;
    int result;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = dictEnd;
    if (smallest > (const BYTE*) source) smallest = (const BYTE*) source;
    LZ4_renormDictT((LZ4_stream_t_internal*)LZ4_dict, smallest);

    result = LZ4_compress_generic(LZ4_dict, source, dest, inputSize, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)inputSize;
    streamPtr->currentOffset += (U32)inputSize;

    return result;
}